

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileimagewindow.cc
# Opt level: O2

bool bgui::anon_unknown_8::isImageColumnEmpty(ImageU8 *image,long i)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = image->depth;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; lVar5 = image->height, uVar3 != uVar4; uVar3 = uVar3 + 1) {
    while (0 < lVar5) {
      lVar2 = lVar5 + -1;
      lVar5 = lVar5 + -1;
      if (image->img[uVar3][lVar2][i] != '\0') goto LAB_00116dc4;
    }
  }
LAB_00116dc4:
  return (long)(int)uVar1 <= (long)uVar3;
}

Assistant:

bool isImageColumnEmpty(const gimage::ImageU8 &image, long i)
{
  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=image.getHeight()-1; k>=0; k--)
    {
      if (image.get(i, k, d) != 0)
      {
        return false;
      }
    }
  }

  return true;
}